

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

void TestSuite::sleep_ms(size_t ms,string *msg)

{
  ulong uVar1;
  undefined8 uVar2;
  unsigned_long in_RDI;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_00000020;
  duration<long,std::ratio<1l,1000l>> adStack_18 [16];
  unsigned_long local_8;
  
  local_8 = in_RDI;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar2 = std::__cxx11::string::c_str();
    _msg("%s (%zu ms)\n",uVar2,local_8);
  }
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_long,void>
            (adStack_18,&local_8);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_00000020);
  return;
}

Assistant:

static void sleep_ms(size_t ms, const std::string& msg = std::string()) {
        if (!msg.empty()) TestSuite::_msg("%s (%zu ms)\n", msg.c_str(), ms);
        std::this_thread::sleep_for(std::chrono::milliseconds(ms));
    }